

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

csptr __thiscall pstack::Reader::view(Reader *this,string *name,Off offset,Off size)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  csptr cVar1;
  enable_shared_from_this<pstack::Reader> local_50;
  undefined1 local_40 [24];
  Off size_local;
  Off offset_local;
  string *name_local;
  Reader *this_local;
  
  size_local = size;
  offset_local = offset;
  name_local = name;
  this_local = this;
  std::enable_shared_from_this<pstack::Reader>::shared_from_this(&local_50);
  std::
  make_shared<pstack::OffsetReader,std::__cxx11::string_const&,std::shared_ptr<pstack::Reader_const>,unsigned_long&,unsigned_long&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             (shared_ptr<const_pstack::Reader> *)offset,(unsigned_long *)&local_50,&size_local);
  std::shared_ptr<pstack::Reader_const>::shared_ptr<pstack::OffsetReader,void>
            ((shared_ptr<pstack::Reader_const> *)this,(shared_ptr<pstack::OffsetReader> *)local_40);
  std::shared_ptr<pstack::OffsetReader>::~shared_ptr((shared_ptr<pstack::OffsetReader> *)local_40);
  std::shared_ptr<const_pstack::Reader>::~shared_ptr((shared_ptr<const_pstack::Reader> *)&local_50);
  cVar1.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  cVar1.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (csptr)cVar1.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Reader::csptr
Reader::view(const std::string &name, Off offset, Off size) const {
   return std::make_shared<OffsetReader>(name, shared_from_this(), offset, size);
}